

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::logTestCrashed(detail *this)

{
  Color col;
  char msg [1024];
  
  builtin_strncpy(msg,"TEST CASE FAILED! (threw exception)\n\n",0x26);
  Color::use((Color *)this,Red);
  printf("%s",msg);
  Color::~Color(&col);
  String::String((String *)&col,msg);
  free(_col);
  return;
}

Assistant:

void logTestCrashed() {
        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "TEST CASE FAILED! (threw exception)\n\n");

        DOCTEST_PRINTF_COLORED(msg, Color::Red);

        printToDebugConsole(String(msg));
    }